

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reliability_Header.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Reliability_Header::Encode(Reliability_Header *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8ReqRelSrv);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding);
  return;
}

Assistant:

void Reliability_Header::Encode( KDataStream & stream ) const
{
    stream << m_ui8ReqRelSrv
           << m_ui16Padding1
           << m_ui8Padding;
}